

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::TiledInputFile::TiledInputFile(TiledInputFile *this,InputPartData *part)

{
  int *in_RSI;
  Context *in_RDI;
  Context *in_stack_ffffffffffffffb8;
  Data *in_stack_ffffffffffffffe0;
  Context *__args;
  
  __args = in_RDI;
  Context::Context(in_RDI,in_stack_ffffffffffffffb8);
  std::make_shared<Imf_3_4::TiledInputFile::Data,Imf_3_4::Context*,int&,int&>
            ((Context **)__args,in_RSI,(int *)in_RDI);
  std::__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x234fce);
  Data::initialize(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

TiledInputFile::TiledInputFile (InputPartData* part)
    : _ctxt (part->context),
      _data (std::make_shared<Data> (&_ctxt, part->partNumber, part->numThreads))
{
    _data->initialize ();
}